

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O0

void cm_zlib__tr_align(deflate_state *s)

{
  uint uVar1;
  int val_3;
  int len_3;
  int val_2;
  int len_2;
  int val_1;
  int len_1;
  int val;
  int len;
  deflate_state *s_local;
  
  if (s->bi_valid < 0xe) {
    s->bi_buf = s->bi_buf | (ushort)(2 << ((byte)s->bi_valid & 0x1f));
    s->bi_valid = s->bi_valid + 3;
  }
  else {
    s->bi_buf = s->bi_buf | (ushort)(2 << ((byte)s->bi_valid & 0x1f));
    uVar1 = s->pending;
    s->pending = uVar1 + 1;
    s->pending_buf[uVar1] = (Bytef)s->bi_buf;
    uVar1 = s->pending;
    s->pending = uVar1 + 1;
    s->pending_buf[uVar1] = (Bytef)(s->bi_buf >> 8);
    s->bi_buf = (ush)(2 >> (0x10U - (char)s->bi_valid & 0x1f));
    s->bi_valid = s->bi_valid + -0xd;
  }
  if (s->bi_valid < 10) {
    s->bi_buf = s->bi_buf | (ushort)(0 << ((byte)s->bi_valid & 0x1f));
    s->bi_valid = s->bi_valid + 7;
  }
  else {
    s->bi_buf = s->bi_buf | (ushort)(0 << ((byte)s->bi_valid & 0x1f));
    uVar1 = s->pending;
    s->pending = uVar1 + 1;
    s->pending_buf[uVar1] = (Bytef)s->bi_buf;
    uVar1 = s->pending;
    s->pending = uVar1 + 1;
    s->pending_buf[uVar1] = (Bytef)(s->bi_buf >> 8);
    s->bi_buf = (ush)(0 >> (0x10U - (char)s->bi_valid & 0x1f));
    s->bi_valid = s->bi_valid + -9;
  }
  bi_flush(s);
  if ((s->last_eob_len + 0xb) - s->bi_valid < 9) {
    if (s->bi_valid < 0xe) {
      s->bi_buf = s->bi_buf | (ushort)(2 << ((byte)s->bi_valid & 0x1f));
      s->bi_valid = s->bi_valid + 3;
    }
    else {
      s->bi_buf = s->bi_buf | (ushort)(2 << ((byte)s->bi_valid & 0x1f));
      uVar1 = s->pending;
      s->pending = uVar1 + 1;
      s->pending_buf[uVar1] = (Bytef)s->bi_buf;
      uVar1 = s->pending;
      s->pending = uVar1 + 1;
      s->pending_buf[uVar1] = (Bytef)(s->bi_buf >> 8);
      s->bi_buf = (ush)(2 >> (0x10U - (char)s->bi_valid & 0x1f));
      s->bi_valid = s->bi_valid + -0xd;
    }
    if (s->bi_valid < 10) {
      s->bi_buf = s->bi_buf | (ushort)(0 << ((byte)s->bi_valid & 0x1f));
      s->bi_valid = s->bi_valid + 7;
    }
    else {
      s->bi_buf = s->bi_buf | (ushort)(0 << ((byte)s->bi_valid & 0x1f));
      uVar1 = s->pending;
      s->pending = uVar1 + 1;
      s->pending_buf[uVar1] = (Bytef)s->bi_buf;
      uVar1 = s->pending;
      s->pending = uVar1 + 1;
      s->pending_buf[uVar1] = (Bytef)(s->bi_buf >> 8);
      s->bi_buf = (ush)(0 >> (0x10U - (char)s->bi_valid & 0x1f));
      s->bi_valid = s->bi_valid + -9;
    }
    bi_flush(s);
  }
  s->last_eob_len = 7;
  return;
}

Assistant:

void _tr_align(s)
    deflate_state *s;
{
    send_bits(s, STATIC_TREES<<1, 3);
    send_code(s, END_BLOCK, static_ltree);
#ifdef DEBUG
    s->compressed_len += 10L; /* 3 for block type, 7 for EOB */
#endif
    bi_flush(s);
    /* Of the 10 bits for the empty block, we have already sent
     * (10 - bi_valid) bits. The lookahead for the last real code (before
     * the EOB of the previous block) was thus at least one plus the length
     * of the EOB plus what we have just sent of the empty static block.
     */
    if (1 + s->last_eob_len + 10 - s->bi_valid < 9) {
        send_bits(s, STATIC_TREES<<1, 3);
        send_code(s, END_BLOCK, static_ltree);
#ifdef DEBUG
        s->compressed_len += 10L;
#endif
        bi_flush(s);
    }
    s->last_eob_len = 7;
}